

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

uint8_t cpuid2_cache_descriptor(CPUCacheInfo *cache)

{
  long lVar1;
  int *piVar2;
  
  if (cache->size == 0) {
    __assert_fail("cache->size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbc,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->level == 0) {
    __assert_fail("cache->level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbd,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->line_size == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbe,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->associativity == 0) {
    __assert_fail("cache->associativity > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbf,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  piVar2 = &cpuid2_cache_descriptors[0].associativity;
  for (lVar1 = 0; lVar1 != 0xed; lVar1 = lVar1 + 1) {
    if ((((piVar2[-3] == (uint)cache->level) &&
         (((CPUID2CacheDescriptorInfo *)(piVar2 + -4))->type == cache->type)) &&
        (piVar2[-2] == cache->size)) &&
       ((piVar2[-1] == (uint)cache->line_size && (*piVar2 == (uint)cache->associativity))))
    goto LAB_004c76bc;
    piVar2 = piVar2 + 5;
  }
  lVar1 = 0xff;
LAB_004c76bc:
  return (uint8_t)lVar1;
}

Assistant:

static uint8_t cpuid2_cache_descriptor(CPUCacheInfo *cache)
{
    int i;

    assert(cache->size > 0);
    assert(cache->level > 0);
    assert(cache->line_size > 0);
    assert(cache->associativity > 0);
    for (i = 0; i < ARRAY_SIZE(cpuid2_cache_descriptors); i++) {
        struct CPUID2CacheDescriptorInfo *d = &cpuid2_cache_descriptors[i];
        if (d->level == cache->level && d->type == cache->type &&
            d->size == cache->size && d->line_size == cache->line_size &&
            d->associativity == cache->associativity) {
                return i;
            }
    }

    return CACHE_DESCRIPTOR_UNAVAILABLE;
}